

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O0

void __thiscall
MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_false>::flush_output
          (ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_false> *this,int outputs)

{
  int outputs_local;
  ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_false> *this_local;
  
  if ((outputs & 1U) != 0) {
    JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::flush(&this->vdp_)
    ;
  }
  if ((outputs & 2U) != 0) {
    update_audio(this);
    Concurrency::AsyncTaskQueue<false,_true,_void>::perform(&(this->speaker_).audio_queue);
  }
  return;
}

Assistant:

void flush_output(int outputs) final {
			if(outputs & Output::Video) {
				vdp_.flush();
			}
			if(outputs & Output::Audio) {
				update_audio();
				speaker_.audio_queue.perform();
			}
		}